

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O1

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributeBackToSignedType<signed_char>
          (KdTreeAttributesDecoder *this,PointAttribute *att,int num_processed_signed_components)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> unsigned_val;
  vector<signed_char,_std::allocator<signed_char>_> signed_val;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<signed_char,_std::allocator<signed_char>_> local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,(ulong)(att->super_GeometryAttribute).num_components_,
             (allocator_type *)&local_40);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_40,(ulong)(att->super_GeometryAttribute).num_components_,&local_59);
  bVar5 = att->num_unique_entries_ == 0;
  if (!bVar5) {
    uVar3 = 0;
    do {
      sVar1 = (att->super_GeometryAttribute).byte_stride_;
      memcpy(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (void *)((long)(((att->super_GeometryAttribute).buffer_)->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                      (att->super_GeometryAttribute).byte_offset_ + sVar1 * uVar3),sVar1);
      if ((att->super_GeometryAttribute).num_components_ != '\0') {
        uVar2 = 0;
        do {
          local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2] =
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2] +
               (char)(this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(long)num_processed_signed_components + uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar2 < (att->super_GeometryAttribute).num_components_);
      }
      sVar1 = (att->super_GeometryAttribute).byte_stride_;
      memcpy((void *)(sVar1 * uVar3 +
                     (long)(((att->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start),
             local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start,sVar1);
      uVar3 = uVar3 + 1;
      bVar4 = uVar3 < att->num_unique_entries_;
      bVar5 = !bVar4;
    } while (bVar4);
  }
  if (local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributeBackToSignedType(
    PointAttribute *att, int num_processed_signed_components) {
  typedef typename std::make_unsigned<SignedDataTypeT>::type UnsignedType;
  std::vector<UnsignedType> unsigned_val(att->num_components());
  std::vector<SignedDataTypeT> signed_val(att->num_components());

  for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
       ++avi) {
    att->GetValue(avi, &unsigned_val[0]);
    for (int c = 0; c < att->num_components(); ++c) {
      // Up-cast |unsigned_val| to int32_t to ensure we don't overflow it for
      // smaller data types. But first check that the up-casting does not cause
      // signed integer overflow.
      if (unsigned_val[c] > std::numeric_limits<int32_t>::max()) {
        return false;
      }
      signed_val[c] = static_cast<SignedDataTypeT>(
          static_cast<int32_t>(unsigned_val[c]) +
          min_signed_values_[num_processed_signed_components + c]);
    }
    att->SetAttributeValue(avi, &signed_val[0]);
  }
  return true;
}